

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkDataTypes.cpp
# Opt level: O1

void __thiscall NDeviceChannel::~NDeviceChannel(NDeviceChannel *this)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  
  (this->super_NetworkDataType)._vptr_NetworkDataType = (_func_int **)&PTR__NDeviceChannel_003edcb8;
  pcVar1 = (this->id)._M_dataplus._M_p;
  paVar2 = &(this->id).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

NDeviceChannel::~NDeviceChannel() {

}